

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

void __thiscall
Kss_Emu::set_voice(Kss_Emu *this,int i,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  Sms_Osc *pSVar1;
  osc_t *poVar2;
  
  poVar2 = (osc_t *)((this->scc).oscs + (i - 3));
  if (i < 3) {
    poVar2 = (this->ay).oscs + i;
  }
  poVar2->output = center;
  if (3 < i || this->sn == (Sms_Apu *)0x0) {
    return;
  }
  pSVar1 = this->sn->oscs[i];
  pSVar1->outputs[1] = right;
  pSVar1->outputs[2] = left;
  pSVar1->outputs[3] = center;
  pSVar1->output = pSVar1->outputs[pSVar1->output_select];
  return;
}

Assistant:

void Kss_Emu::set_voice( int i, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	int i2 = i - ay.osc_count;
	if ( i2 >= 0 )
		scc.osc_output( i2, center );
	else
		ay.osc_output( i, center );
	if ( sn && i < sn->osc_count )
		sn->osc_output( i, center, left, right );
}